

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const*,unsigned_int&,char_const(&)[3],unsigned_int&>
          (String *__return_storage_ptr__,kj *this,char **params,uint *params_1,char (*params_2) [3]
          ,uint *params_3)

{
  char **value;
  kj *pkVar1;
  char (*value_00) [3];
  uint *value_01;
  uint *value_02;
  CappedArray<char,_14UL> local_80;
  ArrayPtr<const_char> local_68;
  CappedArray<char,_14UL> local_58;
  ArrayPtr<const_char> local_40;
  char (*local_30) [3];
  uint *params_local_3;
  char (*params_local_2) [3];
  uint *params_local_1;
  char **params_local;
  
  local_30 = params_2;
  params_local_3 = params_1;
  params_local_2 = (char (*) [3])params;
  params_local_1 = (uint *)this;
  params_local = (char **)__return_storage_ptr__;
  value = fwd<char_const*>((NoInfer<const_char_*> *)this);
  local_40 = toCharSequence<char_const*>(value);
  pkVar1 = (kj *)fwd<unsigned_int&>((uint *)params_local_2);
  toCharSequence<unsigned_int&>(&local_58,pkVar1,value_01);
  value_00 = ::const((char (*) [3])params_local_3);
  local_68 = toCharSequence<char_const(&)[3]>(value_00);
  pkVar1 = (kj *)fwd<unsigned_int&>((uint *)local_30);
  toCharSequence<unsigned_int&>(&local_80,pkVar1,value_02);
  _::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)&local_40,(ArrayPtr<const_char> *)&local_58,
             (CappedArray<char,_14UL> *)&local_68,(ArrayPtr<const_char> *)&local_80,
             (CappedArray<char,_14UL> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}